

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_ec_illegal_argument_tests(void)

{
  int iVar1;
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_args_3 [6];
  unsigned_long _zzq_result_2;
  unsigned_long _zzq_args_2 [6];
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  uchar ctmp [32];
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey zero_pubkey;
  secp256k1_pubkey pubkey;
  int ecount2;
  int ecount;
  _func_void_char_ptr_void_ptr *in_stack_fffffffffffffe18;
  _func_void_char_ptr_void_ptr *fun;
  secp256k1_context *in_stack_fffffffffffffe20;
  secp256k1_context *ctx;
  secp256k1_pubkey *pubkey_00;
  void *in_stack_fffffffffffffe88;
  secp256k1_context *ctx_00;
  secp256k1_nonce_function in_stack_fffffffffffffe90;
  secp256k1_pubkey *pubkey_01;
  secp256k1_context *ctx_01;
  uchar *msghash32;
  uchar *in_stack_fffffffffffffea8;
  secp256k1_ecdsa_signature *signature;
  secp256k1_pubkey *in_stack_fffffffffffffeb0;
  secp256k1_context *ctx_02;
  secp256k1_context *in_stack_fffffffffffffeb8;
  secp256k1_context *ctx_03;
  secp256k1_pubkey *pubkey_02;
  uchar *msghash32_00;
  secp256k1_ecdsa_signature *sig_00;
  secp256k1_context *ctx_04;
  undefined1 local_e8 [96];
  undefined1 local_88 [64];
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_8 = 10;
  secp256k1_context_set_illegal_callback
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(void *)0x11df98);
  secp256k1_context_set_illegal_callback
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(void *)0x11dfb3);
  memset(local_e8,1,0x20);
  memset(local_88,0,0x40);
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x138,
            "test condition failed: secp256k1_ec_pubkey_create(STATIC_CTX, &pubkey, ctmp) == 0");
    abort();
  }
  if (local_4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x139,"test condition failed: ecount == 1");
    abort();
  }
  msghash32_00 = (uchar *)0x4d430001;
  sig_00 = (secp256k1_ecdsa_signature *)&stack0xffffffffffffffb8;
  ctx_04 = (secp256k1_context *)0x40;
  pubkey_02 = (secp256k1_pubkey *)0x0;
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x13b,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1");
    abort();
  }
  signature = (secp256k1_ecdsa_signature *)0x4d430005;
  ctx_02 = (secp256k1_context *)&stack0xffffffffffffffb8;
  ctx_03 = (secp256k1_context *)0x40;
  msghash32 = (uchar *)0x0;
  ctx_01 = (secp256k1_context *)0x0;
  iVar1 = secp256k1_ecdsa_sign
                    (ctx_02,(secp256k1_ecdsa_signature *)0x4d430005,(uchar *)0x0,(uchar *)0x0,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x13d,
            "test condition failed: secp256k1_ecdsa_sign(STATIC_CTX, &sig, ctmp, ctmp, NULL, NULL) == 0"
           );
    abort();
  }
  if (local_4 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x13e,"test condition failed: ecount == 2");
    abort();
  }
  pubkey_00 = (secp256k1_pubkey *)0x0;
  ctx_00 = (secp256k1_context *)0x0;
  pubkey_01 = (secp256k1_pubkey *)0x0;
  iVar1 = secp256k1_ecdsa_sign
                    (ctx_02,signature,msghash32,(uchar *)ctx_01,(secp256k1_nonce_function)0x0,
                     (void *)0x0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x140,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, ctmp, ctmp, NULL, NULL) == 1");
    abort();
  }
  ctx = (secp256k1_context *)0x0;
  fun = (_func_void_char_ptr_void_ptr *)0x0;
  if (local_8 != 10) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x142,"test condition failed: ecount2 == 10");
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify(ctx_04,sig_00,msghash32_00,pubkey_02);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x143,"test condition failed: secp256k1_ecdsa_verify(CTX, &sig, ctmp, &pubkey) == 1");
    abort();
  }
  if (local_8 != 10) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x144,"test condition failed: ecount2 == 10");
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify(ctx_04,sig_00,msghash32_00,pubkey_02);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x145,
            "test condition failed: secp256k1_ecdsa_verify(STATIC_CTX, &sig, ctmp, &pubkey) == 1");
    abort();
  }
  if (local_4 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x146,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_tweak_add(ctx_01,pubkey_01,(uchar *)ctx_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x147,"test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp) == 1");
    abort();
  }
  if (local_8 != 10) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x148,"test condition failed: ecount2 == 10");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_tweak_add(ctx_01,pubkey_01,(uchar *)ctx_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x149,
            "test condition failed: secp256k1_ec_pubkey_tweak_add(STATIC_CTX, &pubkey, ctmp) == 1");
    abort();
  }
  if (local_4 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14a,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_tweak_mul(ctx_03,(secp256k1_pubkey *)ctx_02,signature->data);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14b,"test condition failed: secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, ctmp) == 1");
    abort();
  }
  if (local_8 != 10) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14c,"test condition failed: ecount2 == 10");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_negate(ctx_00,pubkey_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14d,"test condition failed: secp256k1_ec_pubkey_negate(STATIC_CTX, &pubkey) == 1");
    abort();
  }
  if (local_4 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14e,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_negate(ctx_00,pubkey_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14f,"test condition failed: secp256k1_ec_pubkey_negate(CTX, &pubkey) == 1");
    abort();
  }
  if (local_4 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x150,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_negate(ctx_00,pubkey_00);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x151,
            "test condition failed: secp256k1_ec_pubkey_negate(STATIC_CTX, &zero_pubkey) == 0");
    abort();
  }
  if (local_4 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x152,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_negate(ctx_00,pubkey_00);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x153,"test condition failed: secp256k1_ec_pubkey_negate(CTX, NULL) == 0");
    abort();
  }
  if (local_8 != 0xb) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x154,"test condition failed: ecount2 == 11");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_tweak_mul(ctx_03,(secp256k1_pubkey *)ctx_02,signature->data);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x155,
            "test condition failed: secp256k1_ec_pubkey_tweak_mul(STATIC_CTX, &pubkey, ctmp) == 1");
    abort();
  }
  if (local_4 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x156,"test condition failed: ecount == 3");
    abort();
  }
  secp256k1_context_set_illegal_callback(ctx,fun,(void *)0x11eb74);
  secp256k1_context_set_illegal_callback(ctx,fun,(void *)0x11eb87);
  return;
}

Assistant:

static void run_ec_illegal_argument_tests(void) {
    int ecount = 0;
    int ecount2 = 10;
    secp256k1_pubkey pubkey;
    secp256k1_pubkey zero_pubkey;
    secp256k1_ecdsa_signature sig;
    unsigned char ctmp[32];

    /* Setup */
    secp256k1_context_set_illegal_callback(STATIC_CTX, counting_illegal_callback_fn, &ecount);
    secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount2);
    memset(ctmp, 1, 32);
    memset(&zero_pubkey, 0, sizeof(zero_pubkey));

    /* Verify context-type checking illegal-argument errors. */
    CHECK(secp256k1_ec_pubkey_create(STATIC_CTX, &pubkey, ctmp) == 0);
    CHECK(ecount == 1);
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ecdsa_sign(STATIC_CTX, &sig, ctmp, ctmp, NULL, NULL) == 0);
    CHECK(ecount == 2);
    SECP256K1_CHECKMEM_UNDEFINE(&sig, sizeof(sig));
    CHECK(secp256k1_ecdsa_sign(CTX, &sig, ctmp, ctmp, NULL, NULL) == 1);
    SECP256K1_CHECKMEM_CHECK(&sig, sizeof(sig));
    CHECK(ecount2 == 10);
    CHECK(secp256k1_ecdsa_verify(CTX, &sig, ctmp, &pubkey) == 1);
    CHECK(ecount2 == 10);
    CHECK(secp256k1_ecdsa_verify(STATIC_CTX, &sig, ctmp, &pubkey) == 1);
    CHECK(ecount == 2);
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp) == 1);
    CHECK(ecount2 == 10);
    CHECK(secp256k1_ec_pubkey_tweak_add(STATIC_CTX, &pubkey, ctmp) == 1);
    CHECK(ecount == 2);
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, ctmp) == 1);
    CHECK(ecount2 == 10);
    CHECK(secp256k1_ec_pubkey_negate(STATIC_CTX, &pubkey) == 1);
    CHECK(ecount == 2);
    CHECK(secp256k1_ec_pubkey_negate(CTX, &pubkey) == 1);
    CHECK(ecount == 2);
    CHECK(secp256k1_ec_pubkey_negate(STATIC_CTX, &zero_pubkey) == 0);
    CHECK(ecount == 3);
    CHECK(secp256k1_ec_pubkey_negate(CTX, NULL) == 0);
    CHECK(ecount2 == 11);
    CHECK(secp256k1_ec_pubkey_tweak_mul(STATIC_CTX, &pubkey, ctmp) == 1);
    CHECK(ecount == 3);

    /* Clean up */
    secp256k1_context_set_illegal_callback(STATIC_CTX, NULL, NULL);
    secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
}